

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ConvertToHalfPass::IsDecoratedRelaxed(ConvertToHalfPass *this,Instruction *inst)

{
  Instruction *this_00;
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  DecorationManager *this_01;
  reference ppIVar4;
  Instruction *r_inst;
  __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  local_58;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  uint32_t r_id;
  Instruction *inst_local;
  ConvertToHalfPass *this_local;
  
  uVar2 = Instruction::result_id(inst);
  this_01 = Pass::get_decoration_mgr(&this->super_Pass);
  analysis::DecorationManager::GetDecorationsFor
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__begin2,this_01,uVar2,false);
  __end2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)&__begin2);
  local_58._M_current =
       (Instruction **)
       std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::end
                 ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)&__begin2);
  do {
    bVar1 = __gnu_cxx::operator!=(&__end2,&local_58);
    if (!bVar1) {
      r_inst._4_4_ = 2;
LAB_00317b55:
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )&__begin2);
      if (r_inst._4_4_ != 1) {
        this_local._7_1_ = 0;
      }
      return (bool)(this_local._7_1_ & 1);
    }
    ppIVar4 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2);
    this_00 = *ppIVar4;
    OVar3 = Instruction::opcode(this_00);
    if (OVar3 == OpDecorate) {
      uVar2 = Instruction::GetSingleWordInOperand(this_00,1);
      if (uVar2 == 0) {
        this_local._7_1_ = 1;
        r_inst._4_4_ = 1;
        goto LAB_00317b55;
      }
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool ConvertToHalfPass::IsDecoratedRelaxed(Instruction* inst) {
  uint32_t r_id = inst->result_id();
  for (auto r_inst : get_decoration_mgr()->GetDecorationsFor(r_id, false))
    if (r_inst->opcode() == spv::Op::OpDecorate &&
        spv::Decoration(r_inst->GetSingleWordInOperand(1)) ==
            spv::Decoration::RelaxedPrecision) {
      return true;
    }
  return false;
}